

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<float>::VerifySymmetry(TPZMatrix<float> *this,REAL tol)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  uVar2 = 0;
  if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
    bVar4 = lVar1 < 1;
    if (0 < lVar1) {
      lVar5 = 1;
      lVar6 = 0;
      do {
        lVar7 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar6,lVar7);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar7,lVar6);
          if (tol < (double)ABS(extraout_XMM0_Da - extraout_XMM0_Da_00)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Elemento: ",10);
            poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = std::ostream::_M_insert<long>((long)poVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  -> ",5);
            poVar3 = std::ostream::_M_insert<double>
                               ((double)(extraout_XMM0_Da - extraout_XMM0_Da_00));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar6,lVar7)
            ;
            poVar3 = std::ostream::_M_insert<double>((double)extraout_XMM0_Da_01);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            goto LAB_00c6ecb8;
          }
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 1;
        bVar4 = lVar1 <= lVar6;
      } while (lVar6 != lVar1);
    }
LAB_00c6ecb8:
    uVar2 = (uint)bVar4;
  }
  return uVar2;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}